

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.cc
# Opt level: O0

S2PointLoopSpan __thiscall
S2::PruneDegeneracies
          (S2 *this,S2PointLoopSpan loop,
          vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *new_vertices)

{
  S2PointLoopSpan *this_00;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference pVVar4;
  BasicVector<Vector3,_double,_3UL> *pBVar5;
  Vector3<double> *pVVar6;
  long lVar7;
  bool local_81;
  __normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
  local_70;
  int local_64;
  iterator iStack_60;
  int k;
  BasicVector<Vector3,_double,_3UL> *local_58;
  S2Point *v;
  iterator __end1;
  iterator __begin1;
  S2PointLoopSpan *__range1;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *new_vertices_local;
  S2PointLoopSpan loop_local;
  
  __range1 = (S2PointLoopSpan *)loop.super_S2PointSpan.len_;
  loop_local.super_S2PointSpan.ptr_ = loop.super_S2PointSpan.ptr_;
  vertices = (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)__range1;
  new_vertices_local = (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)this;
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::clear
            ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)__range1);
  this_00 = __range1;
  sVar2 = absl::Span<const_Vector3<double>_>::size
                    ((Span<const_Vector3<double>_> *)&new_vertices_local);
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve
            ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)this_00,sVar2);
  __begin1 = (iterator)&new_vertices_local;
  __end1 = absl::Span<const_Vector3<double>_>::begin((Span<const_Vector3<double>_> *)__begin1);
  v = absl::Span<const_Vector3<double>_>::end((Span<const_Vector3<double>_> *)__begin1);
  do {
    if (__end1 == v) {
      sVar2 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size
                        ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)__range1);
      if (sVar2 < 3) {
        memset(&loop_local.super_S2PointSpan.len_,0,0x10);
        S2PointLoopSpan::S2PointLoopSpan((S2PointLoopSpan *)&loop_local.super_S2PointSpan.len_);
      }
      else {
        pBVar5 = (BasicVector<Vector3,_double,_3UL> *)
                 std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                           ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)__range1,0
                           );
        pvVar3 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::back
                           ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)__range1);
        bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                          (pBVar5,pvVar3);
        if (bVar1) {
          std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::pop_back
                    ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)__range1);
        }
        local_64 = 0;
        while( true ) {
          pBVar5 = (BasicVector<Vector3,_double,_3UL> *)
                   std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                             ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)__range1
                              ,(long)(local_64 + 1));
          local_70._M_current =
               (Vector3<double> *)
               std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::end
                         ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)__range1);
          pVVar4 = __gnu_cxx::
                   __normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
                   ::operator[](&local_70,(long)-(local_64 + 1));
          bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                            (pBVar5,pVVar4);
          if (!bVar1) break;
          local_64 = local_64 + 1;
        }
        pVVar6 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::data
                           ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)__range1);
        lVar7 = (long)local_64;
        sVar2 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size
                          ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)__range1);
        S2PointLoopSpan::Span
                  ((S2PointLoopSpan *)&loop_local.super_S2PointSpan.len_,pVVar6 + lVar7,
                   sVar2 - (long)(local_64 << 1));
      }
      return (S2PointLoopSpan)stack0xffffffffffffffe8;
    }
    local_58 = (BasicVector<Vector3,_double,_3UL> *)__end1;
    bVar1 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::empty
                      ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)__range1);
    pBVar5 = local_58;
    if (bVar1) {
LAB_004a8aed:
      sVar2 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size
                        ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)__range1);
      pBVar5 = local_58;
      local_81 = false;
      if (1 < sVar2) {
        iStack_60 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::end
                              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)
                               __range1);
        pVVar4 = __gnu_cxx::
                 __normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
                 ::operator[](&stack0xffffffffffffffa0,-2);
        local_81 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                             (pBVar5,pVVar4);
      }
      if (local_81 == false) {
        std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
                  ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)__range1,
                   (value_type *)local_58);
      }
      else {
        std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::pop_back
                  ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)__range1);
      }
    }
    else {
      pvVar3 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::back
                         ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)__range1);
      bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                        (pBVar5,pvVar3);
      if (bVar1) goto LAB_004a8aed;
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

S2PointLoopSpan PruneDegeneracies(S2PointLoopSpan loop,
                                  vector<S2Point>* new_vertices) {
  vector<S2Point>& vertices = *new_vertices;
  vertices.clear();
  vertices.reserve(loop.size());
  for (const S2Point& v : loop) {
    // Remove duplicate vertices.
    if (vertices.empty() || v != vertices.back()) {
      // Remove edge pairs of the form ABA.
      if (vertices.size() >= 2 && v == vertices.end()[-2]) {
        vertices.pop_back();
      } else {
        vertices.push_back(v);
      }
    }
  }
  // Check whether the loop was completely degenerate.
  if (vertices.size() < 3) return S2PointLoopSpan();

  // Otherwise some portion of the loop is guaranteed to be non-degenerate.
  // However there may still be some degenerate portions to remove.
  if (vertices[0] == vertices.back()) vertices.pop_back();

  // If the loop begins with BA and ends with A, then there is an edge pair of
  // the form ABA at the end/start of the loop.  Remove all such pairs.  As
  // noted above, this is guaranteed to leave a non-degenerate loop.
  int k = 0;
  while (vertices[k + 1] == vertices.end()[-(k + 1)]) ++k;
  return S2PointLoopSpan(vertices.data() + k, vertices.size() - 2 * k);
}